

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_FonName(Cba_Ntk_t *p,int f)

{
  int iVar1;
  int f_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkHasFonNames(p);
  if (iVar1 == 0) {
    __assert_fail("Cba_NtkHasFonNames(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
  }
  iVar1 = Cba_FonIsReal(f);
  if (iVar1 != 0) {
    iVar1 = Vec_IntGetEntry(&p->vFonName,f);
    return iVar1;
  }
  __assert_fail("Cba_FonIsReal(f)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_FonName( Cba_Ntk_t * p, int f )             { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); return Vec_IntGetEntry( &p->vFonName, f );                        }